

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O3

void __thiscall WriteIncludesBase::acceptCustomWidget(WriteIncludesBase *this,DomCustomWidget *node)

{
  long in_FS_OFFSET;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (node->m_class).d.d;
  local_20.d.ptr = (node->m_class).d.ptr;
  local_20.d.size = (node->m_class).d.size;
  if (&(local_20.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_20.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_20.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_20.d.size != 0) {
    add(this,&local_20,node);
  }
  if (&(local_20.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_20.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_20.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_20.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptCustomWidget(DomCustomWidget *node)
{
    const QString className = node->elementClass();
    if (!className.isEmpty())
        add(className, node);
}